

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

QNonContiguousByteDevice * __thiscall
QNetworkReplyHttpImplPrivate::createUploadByteDevice(QNetworkReplyHttpImplPrivate *this)

{
  bool bVar1;
  QNetworkReplyHttpImpl *pQVar2;
  element_type *peVar3;
  QNetworkReplyHttpImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyHttpImpl *q;
  shared_ptr<QNonContiguousByteDevice> *in_stack_ffffffffffffff98;
  element_type *local_48;
  Connection local_40;
  QIODevice local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->outgoingDataBuffer);
  if (bVar1) {
    std::shared_ptr<QRingBuffer>::shared_ptr
              ((shared_ptr<QRingBuffer> *)in_RDI,
               (shared_ptr<QRingBuffer> *)in_stack_ffffffffffffff98);
    QNonContiguousByteDeviceFactory::createShared(local_18,local_28);
    std::shared_ptr<QNonContiguousByteDevice>::operator=
              ((shared_ptr<QNonContiguousByteDevice> *)in_RDI,in_stack_ffffffffffffff98);
    std::shared_ptr<QNonContiguousByteDevice>::~shared_ptr
              ((shared_ptr<QNonContiguousByteDevice> *)0x31aaeb);
    std::shared_ptr<QRingBuffer>::~shared_ptr((shared_ptr<QRingBuffer> *)0x31aaf5);
  }
  else {
    if (in_RDI->outgoingData == (QIODevice *)0x0) {
      local_48 = (element_type *)0x0;
      goto LAB_0031abad;
    }
    QNonContiguousByteDeviceFactory::createShared(local_38);
    std::shared_ptr<QNonContiguousByteDevice>::operator=
              ((shared_ptr<QNonContiguousByteDevice> *)in_RDI,in_stack_ffffffffffffff98);
    std::shared_ptr<QNonContiguousByteDevice>::~shared_ptr
              ((shared_ptr<QNonContiguousByteDevice> *)0x31ab3c);
  }
  if ((in_RDI->synchronous & 1U) == 0) {
    peVar3 = std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(in_RDI->uploadByteDevice).
                         super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>);
    QObject::connect((QObject *)&local_40,(char *)peVar3,(QObject *)"2readProgress(qint64,qint64)",
                     (char *)pQVar2,0x3d824a);
    QMetaObject::Connection::~Connection(&local_40);
  }
  local_48 = std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(in_RDI->uploadByteDevice).
                         super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>);
LAB_0031abad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

QNonContiguousByteDevice* QNetworkReplyHttpImplPrivate::createUploadByteDevice()
{
    Q_Q(QNetworkReplyHttpImpl);

    if (outgoingDataBuffer)
        uploadByteDevice = QNonContiguousByteDeviceFactory::createShared(outgoingDataBuffer);
    else if (outgoingData) {
        uploadByteDevice = QNonContiguousByteDeviceFactory::createShared(outgoingData);
    } else {
        return nullptr;
    }

    // We want signal emissions only for normal asynchronous uploads
    if (!synchronous)
        QObject::connect(uploadByteDevice.get(), SIGNAL(readProgress(qint64,qint64)),
                         q, SLOT(emitReplyUploadProgress(qint64,qint64)));

    return uploadByteDevice.get();
}